

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Iterator * __thiscall
leveldb::DBImpl::NewInternalIterator
          (DBImpl *this,ReadOptions *options,SequenceNumber *latest_snapshot,uint32_t *seed)

{
  int *piVar1;
  Mutex *__mutex;
  Version *pVVar2;
  MemTable *pMVar3;
  MemTable *pMVar4;
  int iVar5;
  uint32_t uVar6;
  Iterator *this_00;
  long *arg1;
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> list;
  Iterator *local_50;
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> local_48;
  
  __mutex = &this->mutex_;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    *latest_snapshot = this->versions_->last_sequence_;
    local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl.
    super__Vector_impl_data._M_start = (Iterator **)0x0;
    local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (Iterator **)0x0;
    local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Iterator **)0x0;
    local_50 = MemTable::NewIterator(this->mem_);
    if (local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>>::
      _M_realloc_insert<leveldb::Iterator*>
                ((vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>> *)&local_48,
                 (iterator)
                 local_48.
                 super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_50);
    }
    else {
      *local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
       _M_impl.super__Vector_impl_data._M_finish = local_50;
      local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    piVar1 = &this->mem_->refs_;
    *piVar1 = *piVar1 + 1;
    if (this->imm_ != (MemTable *)0x0) {
      local_50 = MemTable::NewIterator(this->imm_);
      if (local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>>::
        _M_realloc_insert<leveldb::Iterator*>
                  ((vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>> *)&local_48,
                   (iterator)
                   local_48.
                   super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_50);
      }
      else {
        *local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_50;
        local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      piVar1 = &this->imm_->refs_;
      *piVar1 = *piVar1 + 1;
    }
    Version::AddIterators(this->versions_->current_,options,&local_48);
    this_00 = NewMergingIterator(&(this->internal_comparator_).super_Comparator,
                                 local_48.
                                 super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (int)((ulong)((long)local_48.
                                                  super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_48.
                                                  super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
    Version::Ref(this->versions_->current_);
    arg1 = (long *)operator_new(0x20);
    pMVar3 = this->mem_;
    pMVar4 = this->imm_;
    pVVar2 = this->versions_->current_;
    *arg1 = (long)__mutex;
    arg1[1] = (long)pVVar2;
    arg1[2] = (long)pMVar3;
    arg1[3] = (long)pMVar4;
    Iterator::RegisterCleanup(this_00,anon_unknown_35::CleanupIteratorState,arg1,(void *)0x0);
    uVar6 = this->seed_ + 1;
    this->seed_ = uVar6;
    *seed = uVar6;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (local_48.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (Iterator **)0x0) {
      operator_delete(local_48.
                      super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return this_00;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

Iterator* DBImpl::NewInternalIterator(const ReadOptions& options,
                                      SequenceNumber* latest_snapshot,
                                      uint32_t* seed) {
  mutex_.Lock();
  *latest_snapshot = versions_->LastSequence();

  // Collect together all needed child iterators
  std::vector<Iterator*> list;
  list.push_back(mem_->NewIterator());
  mem_->Ref();
  if (imm_ != nullptr) {
    list.push_back(imm_->NewIterator());
    imm_->Ref();
  }
  versions_->current()->AddIterators(options, &list);
  Iterator* internal_iter =
      NewMergingIterator(&internal_comparator_, &list[0], list.size());
  versions_->current()->Ref();

  IterState* cleanup = new IterState(&mutex_, mem_, imm_, versions_->current());
  internal_iter->RegisterCleanup(CleanupIteratorState, cleanup, nullptr);

  *seed = ++seed_;
  mutex_.Unlock();
  return internal_iter;
}